

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libclient.cpp
# Opt level: O2

string * __thiscall client::invoke(string *__return_storage_ptr__,client *this,string *request)

{
  message request_message;
  message reply_message;
  allocator<char> local_91;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_80 [40];
  string local_58 [32];
  undefined1 local_38 [8];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  size_type local_28;
  
  std::__cxx11::string::string(local_58,(string *)request);
  message::message((message *)local_80,local_58);
  std::__cxx11::string::~string(local_58);
  message::message((message *)local_38,(message *)local_80);
  local_88.current._M_current =
       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(local_30._M_current + local_28);
  local_90.current._M_current =
       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )local_30._M_current;
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,void>
            ((string *)__return_storage_ptr__,&local_88,&local_90,&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string client::invoke(const std::string& request) {
    message request_message(request);
    // Invoke server here.
    const auto reply_message = request_message;
    return {reply_message.body().crbegin(), reply_message.body().crend()};
}